

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O2

Ray * __thiscall
ThinlensCamera::sampleray
          (Ray *__return_storage_ptr__,ThinlensCamera *this,vec2f pos,Sampler *sampler)

{
  float fVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  vec3f vVar2;
  vec3f vVar3;
  vec3f vVar4;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  float local_78;
  float fStack_74;
  vec3f local_68;
  undefined1 local_58 [16];
  vec3f local_40;
  
  (*sampler->_vptr_Sampler[5])(sampler);
  fVar1 = this->lensradius;
  vVar2 = normalized(&this->lefthalf);
  vVar3 = normalized(&this->uphalf);
  local_b8 = vVar2.x;
  fStack_b4 = vVar2.y;
  local_40.x = fVar1 * (extraout_XMM0_Db * vVar3.x + extraout_XMM0_Da * local_b8);
  local_40.y = fVar1 * (extraout_XMM0_Db * vVar3.y + extraout_XMM0_Da * fStack_b4);
  local_40.z = (vVar3.z * extraout_XMM0_Db + vVar2.z * extraout_XMM0_Da) * fVar1;
  local_a8 = pos.x;
  vVar2 = operator*(1.0 - (local_a8 + local_a8),&this->lefthalf);
  local_68.z = vVar2.z;
  local_68._0_8_ = vVar2._0_8_;
  vVar2 = operator+((vec3f *)&(this->super_Camera).field_0x3c,&local_68);
  fStack_a4 = pos.y;
  vVar3 = operator*(1.0 - (fStack_a4 + fStack_a4),&this->uphalf);
  fVar1 = this->focaldistance;
  local_58 = ZEXT416((uint)fVar1);
  vVar4 = operator+(&(this->super_Camera).position,&local_40);
  local_98 = vVar3.x;
  fStack_94 = vVar3.y;
  local_78 = vVar2.x;
  fStack_74 = vVar2.y;
  local_68.z = (vVar3.z + vVar2.z) * fVar1 - local_40.z;
  local_68.y = (float)local_58._0_4_ * (fStack_94 + fStack_74) - local_40.y;
  local_68.x = (float)local_58._0_4_ * (local_98 + local_78) - local_40.x;
  vVar2 = normalized(&local_68);
  (__return_storage_ptr__->origin).x = (float)(int)vVar4._0_8_;
  (__return_storage_ptr__->origin).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  (__return_storage_ptr__->origin).z = vVar4.z;
  (__return_storage_ptr__->dir).x = (float)(int)vVar2._0_8_;
  (__return_storage_ptr__->dir).y = (float)(int)((ulong)vVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->dir).z = vVar2.z;
  return __return_storage_ptr__;
}

Assistant:

Ray sampleray(vec2f pos, Sampler& sampler) const {
		vec2f u = sampler.sampleUnitDisk();
		vec3f aperture_sample = lensradius * (u.x * normalized(lefthalf) + u.y * normalized(uphalf));
		vec3f focused_rel = (dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf) * focaldistance;
		return Ray(position + aperture_sample, normalized(focused_rel - aperture_sample));
	}